

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O3

int __thiscall Imf_2_5::TiledInputFile::levelWidth(TiledInputFile *this,int lx)

{
  Data *pDVar1;
  int iVar2;
  stringstream _iex_replace_s;
  
  pDVar1 = this->_data;
  iVar2 = levelSize(pDVar1->minX,pDVar1->maxX,lx,(pDVar1->tileDesc).roundingMode);
  return iVar2;
}

Assistant:

int
TiledInputFile::levelWidth (int lx) const
{
    try
    {
        return levelSize (_data->minX, _data->maxX, lx,
			  _data->tileDesc.roundingMode);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Error calling levelWidth() on image "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}